

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::LineInput::get_fields(LineInput *this,char *separators)

{
  char *local_28;
  char *tok;
  char *context;
  char *separators_local;
  LineInput *this_local;
  
  context = separators;
  separators_local = (char *)this;
  std::vector<char_*,_std::allocator<char_*>_>::resize(&this->field_,0);
  tok = (char *)0x0;
  local_28 = strtok_r(this->line_,context,&tok);
  while (local_28 != (char *)0x0) {
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->field_,&local_28);
    local_28 = strtok_r((char *)0x0,context,&tok);
  }
  return;
}

Assistant:

void LineInput::get_fields(const char* separators) {
        field_.resize(0);
        char* context = nullptr;
        char* tok = safe_strtok(line_, separators, &context);
        while(tok != nullptr) {
            field_.push_back(tok);
            tok = safe_strtok(nullptr, separators, &context);
        }
    }